

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::C_formatter<spdlog::details::scoped_padder>::format
          (C_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  size_t sVar1;
  byte bVar2;
  buffer<char> *buf;
  ulong uVar3;
  uint uVar4;
  string_view fmt;
  format_args args;
  scoped_padder p;
  scoped_padder local_50;
  uint local_28 [4];
  
  scoped_padder::scoped_padder(&local_50,2,&(this->super_flag_formatter).padinfo_,dest);
  uVar4 = tm_time->tm_year % 100;
  if (uVar4 < 100) {
    sVar1 = (dest->super_buffer<char>).size_;
    uVar3 = sVar1 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
      sVar1 = (dest->super_buffer<char>).size_;
      uVar3 = sVar1 + 1;
    }
    bVar2 = (byte)((uVar4 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar3;
    (dest->super_buffer<char>).ptr_[sVar1] = bVar2 | 0x30;
    sVar1 = (dest->super_buffer<char>).size_;
    uVar3 = sVar1 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
      sVar1 = (dest->super_buffer<char>).size_;
      uVar3 = sVar1 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar3;
    (dest->super_buffer<char>).ptr_[sVar1] = (char)uVar4 + bVar2 * -10 | 0x30;
  }
  else {
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_28;
    args.desc_ = 1;
    local_28[0] = uVar4;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt,args,(locale_ref)0x0);
  }
  scoped_padder::~scoped_padder(&local_50);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_year % 100, dest);
    }